

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

string * duckdb::Exception::ConstructMessageRecursive<std::__cxx11::string>
                   (string *msg,
                   vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
                   *values,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param)

{
  string *in_RCX;
  vector *in_RSI;
  string *in_RDI;
  value_type *in_stack_ffffffffffffff48;
  string local_78 [32];
  undefined1 local_58 [72];
  vector *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::string::string(local_78,in_RCX);
  duckdb::ExceptionFormatValue::CreateFormatValue<std::__cxx11::string>(local_58,local_78);
  std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  push_back((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
            in_RCX,in_stack_ffffffffffffff48);
  ExceptionFormatValue::~ExceptionFormatValue((ExceptionFormatValue *)0x60efd9);
  std::__cxx11::string::~string(local_78);
  duckdb::Exception::ConstructMessageRecursive(in_RDI,local_10);
  return in_RDI;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}